

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall VmaJsonWriter::BeginString(VmaJsonWriter *this,char *pStr)

{
  VmaStringBuilder *in_RSI;
  long in_RDI;
  VmaJsonWriter *unaff_retaddr;
  
  BeginValue(unaff_retaddr,SUB81((ulong)in_RDI >> 0x38,0));
  VmaStringBuilder::Add(in_RSI,(char)((ulong)in_RDI >> 0x38));
  *(undefined1 *)(in_RDI + 0x28) = 1;
  if ((in_RSI != (VmaStringBuilder *)0x0) &&
     (*(char *)&(in_RSI->m_Data).m_Allocator.m_pCallbacks != '\0')) {
    ContinueString(this,pStr);
  }
  return;
}

Assistant:

void VmaJsonWriter::BeginString(const char* pStr)
{
    VMA_ASSERT(!m_InsideString);

    BeginValue(true);
    m_SB.Add('"');
    m_InsideString = true;
    if (pStr != VMA_NULL && pStr[0] != '\0')
    {
        ContinueString(pStr);
    }
}